

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O3

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_false,_1>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_1> *alhs,
          const_blas_data_mapper<float,_long,_1> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  
  pfVar13 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
  lVar1 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
  if (rows < 8 || 32000 < (ulong)(lVar1 * 4)) {
    uVar17 = 0;
  }
  else {
    pfVar15 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar2 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    pfVar18 = pfVar13 + lVar1 * 7;
    pfVar10 = pfVar13 + lVar1 * 6;
    local_d0 = pfVar13 + lVar1 * 5;
    local_d8 = pfVar13 + lVar1 * 4;
    local_e0 = pfVar13 + lVar1 * 3;
    local_e8 = pfVar13 + lVar1 * 2;
    local_f0 = pfVar13 + lVar1;
    uVar17 = 0;
    pfVar12 = pfVar13;
    do {
      if (cols < 4) {
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar49 = 0.0;
        fVar50 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        lVar16 = 0;
      }
      else {
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar49 = 0.0;
        fVar50 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        pfVar8 = pfVar15;
        lVar9 = 0;
        do {
          fVar3 = *pfVar8;
          fVar4 = pfVar8[1];
          fVar5 = pfVar8[2];
          fVar6 = pfVar8[3];
          pfVar11 = pfVar12 + lVar9;
          fVar23 = fVar23 + *pfVar11 * fVar3;
          fVar24 = fVar24 + pfVar11[1] * fVar4;
          fVar25 = fVar25 + pfVar11[2] * fVar5;
          fVar26 = fVar26 + pfVar11[3] * fVar6;
          pfVar11 = pfVar12 + lVar9 + lVar1;
          fVar47 = fVar47 + *pfVar11 * fVar3;
          fVar48 = fVar48 + pfVar11[1] * fVar4;
          fVar49 = fVar49 + pfVar11[2] * fVar5;
          fVar50 = fVar50 + pfVar11[3] * fVar6;
          pfVar11 = pfVar12 + lVar9 + lVar1 * 2;
          fVar43 = fVar43 + *pfVar11 * fVar3;
          fVar44 = fVar44 + pfVar11[1] * fVar4;
          fVar45 = fVar45 + pfVar11[2] * fVar5;
          fVar46 = fVar46 + pfVar11[3] * fVar6;
          pfVar11 = pfVar12 + lVar9 + lVar1 * 3;
          fVar39 = fVar39 + *pfVar11 * fVar3;
          fVar40 = fVar40 + pfVar11[1] * fVar4;
          fVar41 = fVar41 + pfVar11[2] * fVar5;
          fVar42 = fVar42 + pfVar11[3] * fVar6;
          pfVar11 = pfVar12 + lVar9 + lVar1 * 4;
          fVar19 = fVar19 + *pfVar11 * fVar3;
          fVar20 = fVar20 + pfVar11[1] * fVar4;
          fVar21 = fVar21 + pfVar11[2] * fVar5;
          fVar22 = fVar22 + pfVar11[3] * fVar6;
          pfVar11 = pfVar12 + lVar9 + lVar1 * 5;
          fVar35 = fVar35 + *pfVar11 * fVar3;
          fVar36 = fVar36 + pfVar11[1] * fVar4;
          fVar37 = fVar37 + pfVar11[2] * fVar5;
          fVar38 = fVar38 + pfVar11[3] * fVar6;
          pfVar11 = pfVar12 + lVar9 + lVar1 * 6;
          pfVar7 = pfVar12 + lVar9 + lVar1 * 7;
          fVar31 = fVar31 + *pfVar11 * fVar3;
          fVar32 = fVar32 + pfVar11[1] * fVar4;
          fVar33 = fVar33 + pfVar11[2] * fVar5;
          fVar34 = fVar34 + pfVar11[3] * fVar6;
          fVar27 = fVar27 + *pfVar7 * fVar3;
          fVar28 = fVar28 + pfVar7[1] * fVar4;
          fVar29 = fVar29 + pfVar7[2] * fVar5;
          fVar30 = fVar30 + pfVar7[3] * fVar6;
          lVar16 = lVar9 + 4;
          lVar14 = lVar9 + 8;
          pfVar8 = pfVar8 + lVar2 * 4;
          lVar9 = lVar16;
        } while (lVar14 <= cols);
      }
      fVar23 = fVar26 + fVar24 + fVar25 + fVar23;
      fVar24 = fVar50 + fVar48 + fVar49 + fVar47;
      fVar25 = fVar46 + fVar44 + fVar45 + fVar43;
      fVar26 = fVar42 + fVar40 + fVar41 + fVar39;
      fVar19 = fVar22 + fVar20 + fVar21 + fVar19;
      fVar20 = fVar38 + fVar36 + fVar37 + fVar35;
      fVar21 = fVar34 + fVar32 + fVar33 + fVar31;
      fVar22 = fVar30 + fVar28 + fVar29 + fVar27;
      if (lVar16 < cols) {
        pfVar8 = (float *)(lVar16 * lVar2 * 4 + (long)pfVar15);
        lVar9 = 0;
        do {
          fVar27 = *pfVar8;
          fVar23 = fVar23 + pfVar12[lVar16 + lVar9] * fVar27;
          fVar24 = fVar24 + local_f0[lVar16 + lVar9] * fVar27;
          fVar25 = fVar25 + local_e8[lVar16 + lVar9] * fVar27;
          fVar26 = fVar26 + local_e0[lVar16 + lVar9] * fVar27;
          fVar19 = fVar19 + local_d8[lVar16 + lVar9] * fVar27;
          fVar20 = fVar20 + local_d0[lVar16 + lVar9] * fVar27;
          fVar21 = fVar21 + pfVar10[lVar16 + lVar9] * fVar27;
          fVar22 = fVar22 + pfVar18[lVar16 + lVar9] * fVar27;
          lVar9 = lVar9 + 1;
          pfVar8 = pfVar8 + lVar2;
        } while (cols - lVar16 != lVar9);
      }
      res[uVar17 * resIncr] = alpha * fVar23 + res[uVar17 * resIncr];
      lVar9 = (uVar17 | 1) * resIncr;
      res[lVar9] = fVar24 * alpha + res[lVar9];
      lVar9 = (uVar17 | 2) * resIncr;
      res[lVar9] = fVar25 * alpha + res[lVar9];
      lVar9 = (uVar17 | 3) * resIncr;
      res[lVar9] = fVar26 * alpha + res[lVar9];
      lVar9 = (uVar17 | 4) * resIncr;
      res[lVar9] = alpha * fVar19 + res[lVar9];
      lVar9 = (uVar17 | 5) * resIncr;
      res[lVar9] = fVar20 * alpha + res[lVar9];
      lVar9 = (uVar17 | 6) * resIncr;
      res[lVar9] = fVar21 * alpha + res[lVar9];
      lVar9 = (uVar17 | 7) * resIncr;
      res[lVar9] = fVar22 * alpha + res[lVar9];
      uVar17 = uVar17 + 8;
      pfVar12 = pfVar12 + lVar1 * 8;
      pfVar18 = pfVar18 + lVar1 * 8;
      pfVar10 = pfVar10 + lVar1 * 8;
      local_d0 = local_d0 + lVar1 * 8;
      local_d8 = local_d8 + lVar1 * 8;
      local_e0 = local_e0 + lVar1 * 8;
      local_e8 = local_e8 + lVar1 * 8;
      local_f0 = local_f0 + lVar1 * 8;
    } while ((long)uVar17 < rows + -7);
  }
  if ((long)uVar17 < rows + -3) {
    pfVar8 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar2 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    pfVar10 = pfVar13 + uVar17 * lVar1;
    pfVar15 = pfVar13 + (uVar17 + 1) * lVar1;
    pfVar12 = pfVar13 + (uVar17 + 2) * lVar1;
    pfVar18 = pfVar13 + (uVar17 + 3) * lVar1;
    do {
      if (cols < 4) {
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        lVar16 = 0;
      }
      else {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        pfVar11 = pfVar8;
        lVar9 = 0;
        do {
          fVar35 = *pfVar11;
          fVar36 = pfVar11[1];
          fVar37 = pfVar11[2];
          fVar38 = pfVar11[3];
          pfVar7 = pfVar10 + lVar9;
          fVar19 = fVar19 + *pfVar7 * fVar35;
          fVar20 = fVar20 + pfVar7[1] * fVar36;
          fVar21 = fVar21 + pfVar7[2] * fVar37;
          fVar22 = fVar22 + pfVar7[3] * fVar38;
          pfVar7 = pfVar15 + lVar9;
          fVar31 = fVar31 + *pfVar7 * fVar35;
          fVar32 = fVar32 + pfVar7[1] * fVar36;
          fVar33 = fVar33 + pfVar7[2] * fVar37;
          fVar34 = fVar34 + pfVar7[3] * fVar38;
          pfVar7 = pfVar12 + lVar9;
          fVar27 = fVar27 + *pfVar7 * fVar35;
          fVar28 = fVar28 + pfVar7[1] * fVar36;
          fVar29 = fVar29 + pfVar7[2] * fVar37;
          fVar30 = fVar30 + pfVar7[3] * fVar38;
          pfVar7 = pfVar18 + lVar9;
          fVar23 = fVar23 + *pfVar7 * fVar35;
          fVar24 = fVar24 + pfVar7[1] * fVar36;
          fVar25 = fVar25 + pfVar7[2] * fVar37;
          fVar26 = fVar26 + pfVar7[3] * fVar38;
          lVar16 = lVar9 + 4;
          lVar14 = lVar9 + 8;
          pfVar11 = pfVar11 + lVar2 * 4;
          lVar9 = lVar16;
        } while (lVar14 <= cols);
      }
      fVar19 = fVar22 + fVar20 + fVar21 + fVar19;
      fVar20 = fVar34 + fVar32 + fVar33 + fVar31;
      fVar21 = fVar30 + fVar28 + fVar29 + fVar27;
      fVar22 = fVar26 + fVar24 + fVar25 + fVar23;
      if (lVar16 < cols) {
        pfVar11 = (float *)(lVar16 * lVar2 * 4 + (long)pfVar8);
        lVar9 = 0;
        do {
          fVar23 = *pfVar11;
          fVar19 = fVar19 + pfVar10[lVar16 + lVar9] * fVar23;
          fVar20 = fVar20 + pfVar15[lVar16 + lVar9] * fVar23;
          fVar21 = fVar21 + pfVar12[lVar16 + lVar9] * fVar23;
          fVar22 = fVar22 + pfVar18[lVar16 + lVar9] * fVar23;
          lVar9 = lVar9 + 1;
          pfVar11 = pfVar11 + lVar2;
        } while (cols - lVar16 != lVar9);
      }
      res[uVar17 * resIncr] = alpha * fVar19 + res[uVar17 * resIncr];
      lVar9 = (uVar17 + 1) * resIncr;
      res[lVar9] = fVar20 * alpha + res[lVar9];
      lVar9 = (uVar17 + 2) * resIncr;
      res[lVar9] = fVar21 * alpha + res[lVar9];
      lVar9 = (uVar17 + 3) * resIncr;
      res[lVar9] = fVar22 * alpha + res[lVar9];
      uVar17 = uVar17 + 4;
      pfVar10 = pfVar10 + lVar1 * 4;
      pfVar15 = pfVar15 + lVar1 * 4;
      pfVar12 = pfVar12 + lVar1 * 4;
      pfVar18 = pfVar18 + lVar1 * 4;
    } while ((long)uVar17 < rows + -3);
  }
  if ((long)uVar17 < rows + -1) {
    pfVar12 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar2 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    pfVar10 = pfVar13 + uVar17 * lVar1;
    pfVar15 = pfVar13 + (uVar17 + 1) * lVar1;
    do {
      if (cols < 4) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        lVar16 = 0;
      }
      else {
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        pfVar18 = pfVar12;
        lVar9 = 0;
        do {
          pfVar8 = pfVar10 + lVar9;
          fVar19 = fVar19 + *pfVar8 * *pfVar18;
          fVar20 = fVar20 + pfVar8[1] * pfVar18[1];
          fVar21 = fVar21 + pfVar8[2] * pfVar18[2];
          fVar22 = fVar22 + pfVar8[3] * pfVar18[3];
          pfVar8 = pfVar15 + lVar9;
          fVar23 = fVar23 + *pfVar8 * *pfVar18;
          fVar24 = fVar24 + pfVar8[1] * pfVar18[1];
          fVar25 = fVar25 + pfVar8[2] * pfVar18[2];
          fVar26 = fVar26 + pfVar8[3] * pfVar18[3];
          lVar16 = lVar9 + 4;
          lVar14 = lVar9 + 8;
          pfVar18 = pfVar18 + lVar2 * 4;
          lVar9 = lVar16;
        } while (lVar14 <= cols);
      }
      fVar19 = fVar22 + fVar20 + fVar21 + fVar19;
      fVar20 = fVar26 + fVar24 + fVar25 + fVar23;
      if (lVar16 < cols) {
        pfVar18 = (float *)(lVar2 * 4 * lVar16 + (long)pfVar12);
        do {
          fVar19 = fVar19 + pfVar10[lVar16] * *pfVar18;
          fVar20 = fVar20 + pfVar15[lVar16] * *pfVar18;
          lVar16 = lVar16 + 1;
          pfVar18 = pfVar18 + lVar2;
        } while (cols != lVar16);
      }
      res[uVar17 * resIncr] = alpha * fVar19 + res[uVar17 * resIncr];
      lVar9 = (uVar17 + 1) * resIncr;
      res[lVar9] = fVar20 * alpha + res[lVar9];
      uVar17 = uVar17 + 2;
      pfVar10 = pfVar10 + lVar1 * 2;
      pfVar15 = pfVar15 + lVar1 * 2;
    } while ((long)uVar17 < rows + -1);
  }
  if ((long)uVar17 < rows) {
    pfVar10 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
    lVar2 = (rhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
    pfVar13 = pfVar13 + lVar1 * uVar17;
    do {
      fVar19 = 0.0;
      fVar21 = 0.0;
      fVar20 = 0.0;
      fVar22 = 0.0;
      if (cols < 4) {
        lVar16 = 0;
        fVar19 = 0.0;
        fVar20 = 0.0;
      }
      else {
        pfVar15 = pfVar10;
        lVar9 = 0;
        do {
          pfVar12 = pfVar13 + lVar9;
          fVar19 = fVar19 + *pfVar12 * *pfVar15;
          fVar21 = fVar21 + pfVar12[1] * pfVar15[1];
          fVar20 = fVar20 + pfVar12[2] * pfVar15[2];
          fVar22 = fVar22 + pfVar12[3] * pfVar15[3];
          lVar16 = lVar9 + 4;
          lVar14 = lVar9 + 8;
          pfVar15 = pfVar15 + lVar2 * 4;
          lVar9 = lVar16;
        } while (lVar14 <= cols);
      }
      fVar19 = fVar22 + fVar21 + fVar20 + fVar19;
      if (lVar16 < cols) {
        pfVar15 = (float *)(lVar2 * 4 * lVar16 + (long)pfVar10);
        do {
          fVar19 = fVar19 + pfVar13[lVar16] * *pfVar15;
          lVar16 = lVar16 + 1;
          pfVar15 = pfVar15 + lVar2;
        } while (cols != lVar16);
      }
      res[uVar17 * resIncr] = fVar19 * alpha + res[uVar17 * resIncr];
      uVar17 = uVar17 + 1;
      pfVar13 = pfVar13 + lVar1;
    } while (uVar17 != rows);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}